

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void arima_predict(arima_object obj,double *inp,int L,double *xpred,double *amse)

{
  size_t __size;
  uint d;
  int N;
  uint ip;
  uint iq;
  double *pdVar1;
  uint uVar2;
  double *C;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  d = obj->d;
  N = obj->N;
  ip = obj->p;
  iq = obj->q;
  C = (double *)malloc((long)(int)d * 8 + 8);
  __size = (long)N * 8;
  W = (double *)malloc(__size);
  resid = (double *)malloc(__size);
  uVar2 = iq + 1;
  if ((int)(iq + 1) <= (int)ip) {
    uVar2 = ip;
  }
  phi = (double *)malloc((long)(int)uVar2 << 3);
  theta = (double *)malloc((long)(int)uVar2 << 3);
  if ((long)(int)d < 1) {
    *C = 1.0;
    dVar6 = obj->mean;
  }
  else {
    deld(d,C);
    dVar6 = 0.0;
  }
  if (0 < (int)d) {
    lVar3 = 1;
    do {
      C[lVar3] = -C[lVar3];
      lVar3 = lVar3 + 1;
    } while ((ulong)d + 1 != lVar3);
  }
  if (0 < N) {
    pdVar1 = obj->res;
    lVar3 = 0;
    do {
      dVar5 = inp[lVar3];
      if ((ulong)d == 0) {
        dVar5 = dVar5 - dVar6;
      }
      W[lVar3] = dVar5;
      resid[lVar3] = pdVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (N != lVar3);
  }
  if (0 < (int)uVar2) {
    memset(theta,0,(ulong)uVar2 << 3);
    memset(phi,0,(ulong)uVar2 << 3);
  }
  if (0 < (int)ip) {
    pdVar1 = obj->phi;
    uVar4 = 0;
    do {
      phi[uVar4] = pdVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (ip != uVar4);
  }
  if (0 < (int)iq) {
    pdVar1 = obj->theta;
    uVar4 = 0;
    do {
      theta[uVar4] = -pdVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (iq != uVar4);
  }
  forkal(ip,iq,d,phi,theta,C + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar4 = 0;
    do {
      xpred[uVar4] = xpred[uVar4] + dVar6;
      uVar4 = uVar4 + 1;
    } while ((uint)L != uVar4);
  }
  free(C);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void arima_predict(arima_object obj,double *inp, int L,double *xpred,double *amse) {
	int d,i,N,ip,iq,ir;
	double *delta,*W,*resid,*phi,*theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	ip = obj->p;
	iq = obj->q;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	forkal(ip, iq, d, phi, theta, delta+1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}